

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::read_int_array(Simulator *this,PCode *code)

{
  int iVar1;
  int iVar2;
  Symbol *this_00;
  int input;
  vector<int,_std::allocator<int>_> array;
  int local_44;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  local_44 = 0;
  this_00 = ScopeTree::resolve(&this->tree_,&code->first_);
  std::istream::operator>>((istream *)&std::cin,&local_44);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,&(this_00->value_).int_array);
  iVar1 = local_44;
  iVar2 = get_second_parameter(this,&code->second_);
  local_40._M_impl.super__Vector_impl_data._M_start[iVar2] = iVar1;
  Symbol::set_value(this_00,(vector<int,_std::allocator<int>_> *)&local_40);
  this_00->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void Simulator::read_int_array(const PCode &code) {
    int input = 0;
    Symbol &symbol = tree_.resolve(code.first());

    std::cin >> input;
    std::vector<int> array = symbol.int_array();
    array[get_second_parameter(code.second())] = input;
    symbol.set_value(array);
    symbol.set_assigned();

    inc_eip();
}